

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StronglyRegularToFA.h
# Opt level: O0

State __thiscall
covenant::StronglyRegularToFA<covenant::Sym>::MapSymToState
          (StronglyRegularToFA<covenant::Sym> *this,SymStateMap *M,Sym S)

{
  bool bVar1;
  value_type *pvVar2;
  pair<int,_unsigned_int> *in_RSI;
  type in_RDI;
  int unaff_retaddr;
  DFA<covenant::Sym> *in_stack_00000008;
  iterator It;
  State q;
  unordered_map<unsigned_int,_unsigned_int,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  *in_stack_ffffffffffffff88;
  unordered_map<unsigned_int,_unsigned_int,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  *in_stack_ffffffffffffffb0;
  iterator<boost::unordered::detail::ptr_node<std::pair<const_unsigned_int,_unsigned_int>_>_>
  local_30;
  int local_24;
  iterator<boost::unordered::detail::ptr_node<std::pair<const_unsigned_int,_unsigned_int>_>_>
  local_20 [3];
  Sym local_8;
  uint local_4;
  
  local_24 = Sym::symID(&local_8);
  local_20[0].node_ =
       (node_pointer)
       boost::unordered::
       unordered_map<unsigned_int,_unsigned_int,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
       ::find(in_stack_ffffffffffffff88,(key_type *)0x22f263);
  local_30.node_ =
       (node_pointer)
       boost::unordered::
       unordered_map<unsigned_int,_unsigned_int,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
       ::end(in_stack_ffffffffffffff88);
  bVar1 = boost::unordered::iterator_detail::
          iterator<boost::unordered::detail::ptr_node<std::pair<const_unsigned_int,_unsigned_int>_>_>
          ::operator!=(local_20,&local_30);
  if (bVar1) {
    pvVar2 = boost::unordered::iterator_detail::
             iterator<boost::unordered::detail::ptr_node<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::operator*((iterator<boost::unordered::detail::ptr_node<std::pair<const_unsigned_int,_unsigned_int>_>_>
                          *)0x22f296);
    local_4 = (uint)mkState(pvVar2->second);
  }
  else {
    DFA<covenant::Sym>::nStates((DFA<covenant::Sym> *)0x22f2c3);
    local_4 = (uint)DFA<covenant::Sym>::state(in_stack_00000008,unaff_retaddr);
    Sym::symID(&local_8);
    std::make_pair<int,unsigned_int&>((int *)in_stack_ffffffffffffff88,(uint *)0x22f2fa);
    boost::unordered::
    unordered_map<unsigned_int,unsigned_int,boost::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
    ::insert<std::pair<int,unsigned_int>>(in_stack_ffffffffffffffb0,in_RSI,in_RDI);
  }
  return (State)local_4;
}

Assistant:

inline State MapSymToState(SymStateMap &M, EdgeSym S)
  {
    SymStateMap::iterator It = M.find(S.symID ());
    if (It != M.end())
      return mkState((*It).second);
    else
    {
      State q = dfa.state(dfa.nStates());
      M.insert(make_pair(S.symID (), q.id));
      return q;
    }
  }